

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.cpp
# Opt level: O0

string * __thiscall MinVR::VRDataIndex::_walkXML(VRDataIndex *this,element *node,string *nameSpace)

{
  byte bVar1;
  bool bVar2;
  attribute *paVar3;
  undefined8 uVar4;
  pointer ppVar5;
  iterator this_00;
  size_type sVar6;
  element *__lhs;
  char *pcVar7;
  element *in_RCX;
  element *in_RDX;
  long in_RSI;
  string *in_RDI;
  element *child;
  VRContainer childNames;
  VRAttributeList al;
  char separator;
  int lastChar;
  int firstChar;
  string valueString;
  iterator it;
  VRCORETYPE_ID typeId;
  string qualifiedName;
  string *out;
  element *in_stack_fffffffffffffa78;
  VRDatum *in_stack_fffffffffffffa80;
  iterator in_stack_fffffffffffffa88;
  VRDatum *in_stack_fffffffffffffa90;
  element *in_stack_fffffffffffffa98;
  iterator in_stack_fffffffffffffaa0;
  iterator in_stack_fffffffffffffaa8;
  allocator<char> *in_stack_fffffffffffffab0;
  undefined7 in_stack_fffffffffffffab8;
  undefined1 in_stack_fffffffffffffabf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffac0;
  string *in_stack_fffffffffffffad0;
  string *this_01;
  VRDataIndex *in_stack_fffffffffffffad8;
  element *in_stack_fffffffffffffb28;
  string local_450 [32];
  string local_430 [23];
  undefined1 in_stack_fffffffffffffbe7;
  string *in_stack_fffffffffffffbe8;
  string *in_stack_fffffffffffffbf0;
  VRDataIndex *in_stack_fffffffffffffbf8;
  string local_3f0 [32];
  element *local_3d0;
  allocator<char> local_379;
  string *in_stack_fffffffffffffc88;
  int *in_stack_fffffffffffffc90;
  string *in_stack_fffffffffffffc98;
  string *in_stack_fffffffffffffca0;
  VRDatum_conflict *in_stack_fffffffffffffca8;
  VRError *in_stack_fffffffffffffcb0;
  allocator<char> local_339;
  string local_338 [32];
  _Base_ptr local_318;
  _Self local_310;
  allocator<char> local_301;
  string local_300 [32];
  _Self local_2e0 [3];
  char in_stack_fffffffffffffd3f;
  string *in_stack_fffffffffffffd40;
  VRCORETYPE_ID *in_stack_fffffffffffffd48;
  string *in_stack_fffffffffffffd50;
  VRDataIndex *in_stack_fffffffffffffd58;
  string local_288 [39];
  char local_261;
  string local_260 [32];
  int local_240;
  int local_23c;
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [38];
  undefined1 local_1d2;
  undefined4 local_1b0;
  _Self local_118;
  allocator<char> local_109;
  string local_108 [32];
  _Self local_e8;
  string local_e0 [32];
  string local_c0 [36];
  VRCORETYPE_ID local_9c;
  allocator<char> local_95 [13];
  string local_88 [32];
  string local_68 [39];
  byte local_41;
  string local_40 [24];
  string *in_stack_ffffffffffffffd8;
  
  std::__cxx11::string::string(local_40);
  local_41 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  element::get_name(in_RDX);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffac0,
             (char *)CONCAT17(in_stack_fffffffffffffabf,in_stack_fffffffffffffab8),
             in_stack_fffffffffffffab0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa88._M_node,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa80);
  std::__cxx11::string::operator=(local_40,local_68);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(local_95);
  element::get_value_abi_cxx11_(in_stack_fffffffffffffa78);
  bVar1 = std::__cxx11::string::empty();
  std::__cxx11::string::~string(local_c0);
  if ((bVar1 & 1) == 0) {
    paVar3 = element::get_attribute
                       ((element *)in_stack_fffffffffffffaa8._M_node,
                        (char *)in_stack_fffffffffffffaa0._M_node);
    if (paVar3 == (attribute *)0x0) {
      bVar2 = element::has_child((element *)0x10aa26);
      if (bVar2) {
        local_9c = VRCORETYPE_CONTAINER;
      }
      else {
        element::get_value_abi_cxx11_(in_stack_fffffffffffffa78);
        local_9c = _inferType(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
        std::__cxx11::string::~string(local_e0);
      }
    }
    else {
      paVar3 = element::get_attribute
                         ((element *)in_stack_fffffffffffffaa8._M_node,
                          (char *)in_stack_fffffffffffffaa0._M_node);
      attribute::get_value(paVar3);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffac0,
                 (char *)CONCAT17(in_stack_fffffffffffffabf,in_stack_fffffffffffffab8),
                 in_stack_fffffffffffffab0);
      local_e8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRCORETYPE_ID,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRCORETYPE_ID>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRCORETYPE_ID,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRCORETYPE_ID>_>_>
                   *)in_stack_fffffffffffffa78,(key_type *)0x10ab43);
      std::__cxx11::string::~string(local_108);
      std::allocator<char>::~allocator(&local_109);
      local_118._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRCORETYPE_ID,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRCORETYPE_ID>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRCORETYPE_ID,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRCORETYPE_ID>_>_>
                  *)in_stack_fffffffffffffa78);
      bVar2 = std::operator==(&local_e8,&local_118);
      if (bVar2) {
        local_1d2 = 1;
        uVar4 = __cxa_allocate_exception(0xa8);
        paVar3 = element::get_attribute
                           ((element *)in_stack_fffffffffffffaa8._M_node,
                            (char *)in_stack_fffffffffffffaa0._M_node);
        attribute::get_value(paVar3);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffac0,
                   (char *)CONCAT17(in_stack_fffffffffffffabf,in_stack_fffffffffffffab8),
                   in_stack_fffffffffffffab0);
        std::operator+((char *)in_stack_fffffffffffffa88._M_node,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffa80);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffac0,
                   (char *)CONCAT17(in_stack_fffffffffffffabf,in_stack_fffffffffffffab8),
                   in_stack_fffffffffffffab0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffac0,
                   (char *)CONCAT17(in_stack_fffffffffffffabf,in_stack_fffffffffffffab8),
                   in_stack_fffffffffffffab0);
        local_1b0 = 0x199;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffac0,
                   (char *)CONCAT17(in_stack_fffffffffffffabf,in_stack_fffffffffffffab8),
                   in_stack_fffffffffffffab0);
        VRError::VRError(in_stack_fffffffffffffcb0,(string *)in_stack_fffffffffffffca8,
                         in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                         in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
        local_1d2 = 0;
        __cxa_throw(uVar4,&VRError::typeinfo,VRError::~VRError);
      }
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRCORETYPE_ID>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRCORETYPE_ID>_>
                             *)in_stack_fffffffffffffa80);
      local_9c = ppVar5->second;
    }
  }
  else {
    local_9c = VRCORETYPE_CONTAINER;
  }
  paVar3 = element::get_attribute
                     ((element *)in_stack_fffffffffffffaa8._M_node,
                      (char *)in_stack_fffffffffffffaa0._M_node);
  if (paVar3 != (attribute *)0x0) {
    *(undefined1 *)(in_RSI + 0x90) = 1;
  }
  paVar3 = element::get_attribute
                     ((element *)in_stack_fffffffffffffaa8._M_node,
                      (char *)in_stack_fffffffffffffaa0._M_node);
  if (paVar3 != (attribute *)0x0) {
    *(undefined1 *)(in_RSI + 0x90) = 1;
  }
  std::__cxx11::string::string(local_1f8);
  element::get_value_abi_cxx11_(in_stack_fffffffffffffa78);
  bVar1 = std::__cxx11::string::empty();
  std::__cxx11::string::~string(local_218);
  if ((bVar1 & 1) == 0) {
    element::get_value_abi_cxx11_(in_stack_fffffffffffffa78);
    std::__cxx11::string::operator=(local_1f8,local_238);
    std::__cxx11::string::~string(local_238);
    local_23c = std::__cxx11::string::find_first_not_of((char *)local_1f8,0x1394e7);
    local_240 = std::__cxx11::string::find_last_not_of((char *)local_1f8,0x1394e7);
    if ((local_23c < 0) || (local_240 < 0)) {
      std::__cxx11::string::operator=(local_1f8,"");
      local_9c = VRCORETYPE_CONTAINER;
    }
    else {
      std::__cxx11::string::substr((ulong)local_260,(ulong)local_1f8);
      std::__cxx11::string::operator=(local_1f8,local_260);
      std::__cxx11::string::~string(local_260);
    }
  }
  else {
    std::__cxx11::string::operator=(local_1f8,"");
  }
  paVar3 = element::get_attribute
                     ((element *)in_stack_fffffffffffffaa8._M_node,
                      (char *)in_stack_fffffffffffffaa0._M_node);
  if (paVar3 == (attribute *)0x0) {
    local_261 = ',';
  }
  else {
    paVar3 = element::get_attribute
                       ((element *)in_stack_fffffffffffffaa8._M_node,
                        (char *)in_stack_fffffffffffffaa0._M_node);
    pcVar7 = attribute::get_value(paVar3);
    local_261 = *pcVar7;
  }
  std::__cxx11::string::string((string *)&stack0xfffffffffffffd58,local_1f8);
  _processValue(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                in_stack_fffffffffffffd40,in_stack_fffffffffffffd3f);
  this_01 = local_288;
  std::__cxx11::string::operator=((string *)in_RDI,this_01);
  std::__cxx11::string::~string(this_01);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffd58);
  element::get_attribute_map_abi_cxx11_(in_stack_fffffffffffffb28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffac0,
             (char *)CONCAT17(in_stack_fffffffffffffabf,in_stack_fffffffffffffab8),
             in_stack_fffffffffffffab0);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffffa78,(key_type *)0x10b225);
  local_2e0[0]._M_node = this_00._M_node;
  local_310._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffa78);
  bVar1 = std::operator!=(local_2e0,&local_310);
  std::__cxx11::string::~string(local_300);
  std::allocator<char>::~allocator(&local_301);
  if ((bVar1 & 1) != 0) {
    in_stack_fffffffffffffab0 = &local_339;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00._M_node,
               (char *)CONCAT17(bVar1,in_stack_fffffffffffffab8),in_stack_fffffffffffffab0);
    in_stack_fffffffffffffaa8 =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffffa78,(key_type *)0x10b2d0);
    local_318 = in_stack_fffffffffffffaa8._M_node;
    in_stack_fffffffffffffaa0 =
         std::
         map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
         ::erase_abi_cxx11_((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa88);
    std::__cxx11::string::~string(local_338);
    std::allocator<char>::~allocator(&local_339);
  }
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)0x10b3f1);
  if (sVar6 != 0) {
    in_stack_fffffffffffffa98 = (element *)&local_379;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00._M_node,
               (char *)CONCAT17(bVar1,in_stack_fffffffffffffab8),in_stack_fffffffffffffab0);
    _getDatum(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
              (bool)in_stack_fffffffffffffbe7);
    in_stack_fffffffffffffa90 = VRDatumPtr::operator->((VRDatumPtr *)&stack0xfffffffffffffca8);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)in_stack_fffffffffffffa80,
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)in_stack_fffffffffffffa78);
    VRDatum::setAttributeList
              (in_stack_fffffffffffffa80,(VRAttributeList *)in_stack_fffffffffffffa78);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x10b4a1);
    VRDatumPtr::~VRDatumPtr((VRDatumPtr *)in_stack_fffffffffffffa90);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffc88);
    std::allocator<char>::~allocator(&local_379);
  }
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x10b569);
  while (__lhs = element::get_next_child(in_stack_fffffffffffffa98), local_3d0 = __lhs,
        __lhs != (element *)0x0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffaa8._M_node,(char *)in_stack_fffffffffffffaa0._M_node);
    pcVar7 = element::get_name(local_3d0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,pcVar7
                  );
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffa90,(value_type *)__lhs);
    std::__cxx11::string::~string(local_3f0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffbf0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffaa8._M_node,(char *)in_stack_fffffffffffffaa0._M_node);
    _walkXML((VRDataIndex *)in_RDX,in_RCX,in_stack_ffffffffffffffd8);
    std::__cxx11::string::~string(local_430);
    std::__cxx11::string::~string(local_450);
  }
  local_41 = 1;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x10b5ac);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x10b5b9);
  std::__cxx11::string::~string(local_1f8);
  if ((local_41 & 1) == 0) {
    std::__cxx11::string::~string((string *)in_RDI);
  }
  std::__cxx11::string::~string(local_40);
  return in_RDI;
}

Assistant:

std::string VRDataIndex::_walkXML(element* node, std::string nameSpace) {
  // This method will return the name of the last top-level element in
  // the input XML.

  std::string qualifiedName;
  std::string out;

  qualifiedName = nameSpace + std::string(node->get_name());

  // What type is this node?
  VRCORETYPE_ID typeId;
  if (node->get_value().empty()) {
    // If the node has no value, we hope it's a container.
    typeId = VRCORETYPE_CONTAINER;

  } else if (node->get_attribute("type") == NULL) {

    if (node->has_child()) {

      typeId = VRCORETYPE_CONTAINER;
    } else {

      typeId = _inferType(std::string(node->get_value()));
    }

  } else {

    // Check to see if the type is one we can handle.
    VRDatum::VRTypeMap::iterator it =
      VRDatum::typeMap.find(std::string(node->get_attribute("type")->get_value()));

    if (it == VRDatum::typeMap.end()) {
      // If not, throw an error.
      VRERRORNOADV("No known type called " +
                   std::string(node->get_attribute("type")->get_value()));
    } else {
      // Otherwise, pass it along as the typeID.
      typeId = it->second;
    }
  }

  // Check to see if this is a link to anywhere.  If it is, signal
  // that we'll need the linking step after the deserialize.
  if (node->get_attribute("linkNode") != NULL) _linkNeeded = true;
  if (node->get_attribute("linkContent") != NULL) _linkNeeded = true;

  // Get a value for the node.
  std::string valueString;
  if (node->get_value().empty()) {

    valueString = "";

  } else {

    // Convert to a string for some minor editing.
    valueString = std::string(node->get_value());

    // Trim leading and trailing spaces, tabs, whatever.
    int firstChar = (int)valueString.find_first_not_of(" \t\r\n");
    int lastChar = (int)valueString.find_last_not_of(" \t\r\n");

    if ((firstChar >= 0) && (lastChar >= 0)) {

      valueString = valueString.substr(firstChar, (1 + lastChar - firstChar));

    } else {

      valueString = "";
      typeId = VRCORETYPE_CONTAINER;
    }
  }

  char separator;
  if (node->get_attribute("separator") == NULL) {

    separator = MINVRSEPARATOR;

  } else {

    separator = *(node->get_attribute("separator")->get_value());
  }

  out = _processValue(qualifiedName,
                     typeId,
                     valueString,
                     separator);

  // There should be a datum object entered for this by here.  So now
  // we can see if there are any attributes to add to the list.
  VRDatum::VRAttributeList al = node->get_attribute_map();
  if (al.find("type") != al.end()) al.erase(al.find("type"));
  if (al.size() > 0) {

    _getDatum(out)->setAttributeList(al);
  }

  // This loops through the node children, if there are any.
  VRContainer childNames;
  while (true) {

    // Pick the next child.
    element* child = node->get_next_child();
    if (child == NULL) {

      return out;
    }

    // Collect a child name on the container's child name list.
    childNames.push_back(qualifiedName + "/" + child->get_name());

    // And go walk its tree.
    _walkXML(child, qualifiedName + "/");
  }
}